

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall QFSFileEngine::setSize(QFSFileEngine *this,qint64 size)

{
  QAbstractFileEnginePrivate *pQVar1;
  FILE *__stream;
  int iVar2;
  long in_FS_OFFSET;
  NativePath local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  iVar2 = *(int *)&pQVar1[3].q_ptr;
  if (iVar2 == -1) {
    __stream = (FILE *)pQVar1[3].errorString.d.ptr;
    if (__stream == (FILE *)0x0) {
      QFileSystemEntry::nativeFilePath(&local_40,(QFileSystemEntry *)(pQVar1 + 1));
      if (local_40.d.ptr == (char *)0x0) {
        local_40.d.ptr = "";
      }
      iVar2 = truncate64(local_40.d.ptr,size);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0012c2ea;
    }
    iVar2 = fileno(__stream);
  }
  iVar2 = ftruncate64(iVar2,size);
LAB_0012c2ea:
  if (iVar2 != 0) {
    setSize(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setSize(qint64 size)
{
    Q_D(QFSFileEngine);
    bool ret = false;
    if (d->fd != -1)
        ret = QT_FTRUNCATE(d->fd, size) == 0;
    else if (d->fh)
        ret = QT_FTRUNCATE(QT_FILENO(d->fh), size) == 0;
    else
        ret = QT_TRUNCATE(d->fileEntry.nativeFilePath().constData(), size) == 0;
    if (!ret)
        setError(QFile::ResizeError, qt_error_string(errno));
    return ret;
}